

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STDAllocator.hpp
# Opt level: O2

VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0> * __thiscall
Diligent::
STDAllocator<VulkanUtilities::VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0>,_Diligent::IMemoryAllocator>
::allocate(STDAllocator<VulkanUtilities::VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0>,_Diligent::IMemoryAllocator>
           *this,size_t count)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*this->m_Allocator->_vptr_IMemoryAllocator[2])
                    (this->m_Allocator,count * 0x18,8,this->m_dvpDescription,this->m_dvpFileName,
                     (ulong)(uint)this->m_dvpLineNumber);
  return (VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0> *)
         CONCAT44(extraout_var,iVar1);
}

Assistant:

T* allocate(std::size_t count)
    {
#ifndef DILIGENT_DEVELOPMENT
        static constexpr const char* m_dvpDescription = "<Unavailable in release build>";
        static constexpr const char* m_dvpFileName    = "<Unavailable in release build>";
        static constexpr Int32       m_dvpLineNumber  = -1;
#endif
        return reinterpret_cast<T*>(m_Allocator.AllocateAligned(count * sizeof(T), alignof(T), m_dvpDescription, m_dvpFileName, m_dvpLineNumber));
    }